

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_tree.cc
# Opt level: O3

void __thiscall sparse_tree::preprocess(sparse_tree *this)

{
  ushort uVar1;
  pointer piVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  
  this->p2[0] = 1;
  iVar5 = 1;
  lVar3 = 0;
  do {
    iVar5 = iVar5 * 2;
    this->p2[lVar3 + 1] = iVar5;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0xd);
  uVar1 = this->n;
  if (uVar1 != 0) {
    piVar2 = (this->logn).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = 1;
    iVar5 = 0;
    uVar6 = 1;
    do {
      piVar2[uVar6] = iVar5 + -1;
      if (uVar6 == uVar4) {
        uVar4 = uVar4 * 2;
        piVar2[uVar6] = iVar5;
        iVar5 = iVar5 + 1;
      }
      uVar6 = uVar6 + 1;
    } while ((uint)uVar1 * 2 != uVar6);
  }
  return;
}

Assistant:

void sparse_tree::preprocess(){
    // memorizing powers of 2
    p2[0] = 1;
    for (int i=1; i<maxSize; i++)
        p2[i] = p2[i-1]*2; 

    // memorizing all log(n) values
    int val = 1,ptr=0;
    for (int i=1; i<2*n; i++){
        logn[i] = ptr-1;
        if (val==i){
            val*=2;
            logn[i] = ptr;
            ptr++;
        }
    }          
}